

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx2.cpp
# Opt level: O2

void ncnn::transpose_pack_B_tile_int8_avx2(Mat *B,Mat *BT,int j,int max_jj,int k,int max_kk)

{
  void *pvVar1;
  int iVar2;
  long lVar3;
  undefined1 (*pauVar4) [16];
  long lVar5;
  long lVar6;
  undefined8 *puVar7;
  long lVar8;
  undefined1 *puVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  bool bVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  long local_70;
  long local_68;
  
  iVar2 = cpu_support_x86_avx_vnni_int8();
  if (iVar2 != 0) {
    transpose_pack_B_tile_int8_avxvnniint8(B,BT,j,max_jj,k,max_kk);
    return;
  }
  iVar2 = cpu_support_x86_avx_vnni();
  if (iVar2 == 0) {
    iVar2 = B->w;
    lVar3 = (long)iVar2;
    pauVar4 = (undefined1 (*) [16])BT->data;
    lVar5 = (long)k;
    lVar13 = (long)(iVar2 * 2);
    lVar8 = (long)j;
    lVar20 = (long)max_jj;
    lVar14 = (iVar2 + 1) + lVar8;
    lVar16 = lVar3 + lVar8;
    lVar18 = (iVar2 + 3) + lVar8;
    local_68 = (iVar2 + 2) + lVar8;
    local_70 = lVar8 + 1;
    lVar21 = lVar8;
    for (uVar12 = 0; (long)(uVar12 | 7) < lVar20; uVar12 = uVar12 + 8) {
      lVar11 = B->w * lVar5 * B->elemsize;
      lVar6 = (long)B->data + lVar21;
      lVar15 = (long)B->data + lVar16;
      for (iVar2 = 0; iVar2 + 1 < max_kk; iVar2 = iVar2 + 2) {
        auVar24._8_8_ = 0;
        auVar24._0_8_ = *(ulong *)(lVar6 + lVar11);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = *(ulong *)(lVar15 + lVar11);
        auVar24 = vpunpcklbw_avx(auVar24,auVar25);
        *pauVar4 = auVar24;
        pauVar4 = pauVar4 + 1;
        lVar6 = lVar6 + lVar13;
        lVar15 = lVar15 + lVar13;
      }
      puVar7 = (undefined8 *)(lVar6 + lVar11);
      for (; iVar2 < max_kk; iVar2 = iVar2 + 1) {
        *(undefined8 *)*pauVar4 = *puVar7;
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 8);
        puVar7 = (undefined8 *)((long)puVar7 + lVar3);
      }
      lVar21 = lVar21 + 8;
      lVar14 = lVar14 + 8;
      lVar16 = lVar16 + 8;
      lVar18 = lVar18 + 8;
      local_68 = local_68 + 8;
      local_70 = local_70 + 8;
    }
    for (; (long)(uVar12 | 3) < lVar20; uVar12 = uVar12 + 4) {
      pvVar1 = B->data;
      lVar11 = B->w * lVar5 * B->elemsize;
      lVar22 = lVar21 + (long)pvVar1;
      lVar19 = lVar18 + (long)pvVar1;
      lVar6 = (long)pvVar1 + local_68;
      lVar15 = lVar14 + (long)pvVar1;
      lVar17 = lVar16 + (long)pvVar1;
      puVar9 = (undefined1 *)((long)pvVar1 + lVar11 + local_70);
      for (iVar2 = 1; iVar2 < max_kk; iVar2 = iVar2 + 2) {
        (*pauVar4)[0] = *(undefined1 *)(lVar22 + lVar11);
        (*pauVar4)[1] = *(undefined1 *)(lVar17 + lVar11);
        (*pauVar4)[2] = *(undefined1 *)(lVar22 + 1 + lVar11);
        (*pauVar4)[3] = *(undefined1 *)(lVar15 + lVar11);
        (*pauVar4)[4] = *(undefined1 *)(lVar22 + 2 + lVar11);
        (*pauVar4)[5] = *(undefined1 *)(lVar6 + lVar11);
        (*pauVar4)[6] = *(undefined1 *)(lVar22 + 3 + lVar11);
        (*pauVar4)[7] = *(undefined1 *)(lVar19 + lVar11);
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 8);
        lVar22 = lVar22 + lVar13;
        lVar19 = lVar19 + lVar13;
        lVar6 = lVar6 + lVar13;
        lVar15 = lVar15 + lVar13;
        lVar17 = lVar17 + lVar13;
        puVar9 = puVar9 + lVar13;
      }
      for (iVar2 = iVar2 + -1; iVar2 < max_kk; iVar2 = iVar2 + 1) {
        (*pauVar4)[0] = puVar9[-1];
        (*pauVar4)[1] = *puVar9;
        (*pauVar4)[2] = puVar9[1];
        (*pauVar4)[3] = puVar9[2];
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 4);
        puVar9 = puVar9 + lVar3;
      }
      lVar21 = lVar21 + 4;
      lVar14 = lVar14 + 4;
      lVar16 = lVar16 + 4;
      lVar18 = lVar18 + 4;
      local_68 = local_68 + 4;
      local_70 = local_70 + 4;
    }
    for (; (long)(uVar12 | 1) < lVar20; uVar12 = uVar12 + 2) {
      pvVar1 = B->data;
      lVar11 = B->w * lVar5 * B->elemsize;
      lVar18 = (long)pvVar1 + lVar21;
      lVar6 = (long)pvVar1 + lVar14;
      lVar15 = (long)pvVar1 + lVar16;
      for (iVar2 = 1; iVar2 < max_kk; iVar2 = iVar2 + 2) {
        (*pauVar4)[0] = *(undefined1 *)(lVar18 + lVar11);
        (*pauVar4)[1] = *(undefined1 *)(lVar15 + lVar11);
        (*pauVar4)[2] = *(undefined1 *)(lVar18 + 1 + lVar11);
        (*pauVar4)[3] = *(undefined1 *)(lVar6 + lVar11);
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 4);
        lVar18 = lVar18 + lVar13;
        lVar6 = lVar6 + lVar13;
        lVar15 = lVar15 + lVar13;
      }
      for (iVar2 = iVar2 + -1; iVar2 < max_kk; iVar2 = iVar2 + 1) {
        (*pauVar4)[0] = *(undefined1 *)(lVar18 + lVar11);
        (*pauVar4)[1] = *(undefined1 *)(lVar18 + 1 + lVar11);
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 2);
        lVar11 = lVar11 + lVar3;
      }
      lVar21 = lVar21 + 2;
      lVar14 = lVar14 + 2;
      lVar16 = lVar16 + 2;
    }
    iVar2 = 0;
    if (0 < max_kk) {
      iVar2 = max_kk;
    }
    for (; (long)uVar12 < lVar20; uVar12 = uVar12 + 1) {
      puVar9 = (undefined1 *)((long)B->data + lVar8 + uVar12 + B->w * lVar5 * B->elemsize);
      iVar10 = iVar2;
      while (bVar23 = iVar10 != 0, iVar10 = iVar10 + -1, bVar23) {
        (*pauVar4)[0] = *puVar9;
        pauVar4 = (undefined1 (*) [16])(*pauVar4 + 1);
        puVar9 = puVar9 + lVar3;
      }
    }
    return;
  }
  transpose_pack_B_tile_int8_avxvnni(B,BT,j,max_jj,k,max_kk);
  return;
}

Assistant:

void transpose_pack_B_tile_int8_avx2(const Mat& B, Mat& BT, int j, int max_jj, int k, int max_kk)
{
    transpose_pack_B_tile_int8(B, BT, j, max_jj, k, max_kk);
}